

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

int * __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::operator[]
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,int *key)

{
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  int local_44;
  pair<int,_int> local_40;
  pair<int,_int> *local_38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_30;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  ValueIterator it;
  size_t bucketIdx;
  int *key_local;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this_local;
  
  it._M_current = (pair<int,_int> *)hash_to_bucket(this,key);
  pvVar2 = std::
           vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ::operator[](&this->mBuckets,(size_type)it._M_current);
  local_28._M_current = (pair<int,_int> *)find_in_bucket(this,pvVar2,key);
  pvVar2 = std::
           vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ::operator[](&this->mBuckets,(size_type)it._M_current);
  local_30._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(pvVar2);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_30);
  if (bVar1) {
    local_44 = 0;
    local_40 = std::make_pair<int_const&,int>(key,&local_44);
    local_38 = (pair<int,_int> *)insert_to_bucket(this,&local_40,(size_t *)&it);
    local_28._M_current = local_38;
  }
  ppVar3 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator->(&local_28);
  return &ppVar3->second;
}

Assistant:

MappedT& operator[](const KeyT& key) {
      size_t bucketIdx = hash_to_bucket(key);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx],key);
      if (it == mBuckets[bucketIdx].end()) { // if not found, insert the new one
        it = insert_to_bucket(std::make_pair(key, MappedT()),bucketIdx);
      }
      return it->second;
    }